

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

appender fmt::v10::detail::write_escaped_cp<fmt::v10::appender,char>
                   (appender out,find_escape_result<char> *escape)

{
  byte *pbVar1;
  long lVar2;
  undefined1 *puVar3;
  appender aVar4;
  uint cp;
  ulong uVar5;
  byte *pbVar6;
  
  cp = escape->cp;
  if ((int)cp < 0x22) {
    if (cp == 9) {
      lVar2 = *(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                              container + 0x10);
      uVar5 = lVar2 + 1;
      if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container
                    + 0x18) < uVar5) {
        (*(code *)**(undefined8 **)
                    out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container)
                  (out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container);
        lVar2 = *(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                                container + 0x10);
        uVar5 = lVar2 + 1;
      }
      *(ulong *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container +
                0x10) = uVar5;
      puVar3 = (undefined1 *)
               (lVar2 + *(long *)((long)out.
                                        super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                                        container + 8));
      cp = 0x74;
    }
    else if (cp == 10) {
      lVar2 = *(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                              container + 0x10);
      uVar5 = lVar2 + 1;
      if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container
                    + 0x18) < uVar5) {
        (*(code *)**(undefined8 **)
                    out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container)
                  (out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container);
        lVar2 = *(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                                container + 0x10);
        uVar5 = lVar2 + 1;
      }
      *(ulong *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container +
                0x10) = uVar5;
      puVar3 = (undefined1 *)
               (lVar2 + *(long *)((long)out.
                                        super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                                        container + 8));
      cp = 0x6e;
    }
    else {
      if (cp != 0xd) goto LAB_0010a397;
      lVar2 = *(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                              container + 0x10);
      uVar5 = lVar2 + 1;
      if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container
                    + 0x18) < uVar5) {
        (*(code *)**(undefined8 **)
                    out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container)
                  (out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container);
        lVar2 = *(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                                container + 0x10);
        uVar5 = lVar2 + 1;
      }
      *(ulong *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container +
                0x10) = uVar5;
      puVar3 = (undefined1 *)
               (lVar2 + *(long *)((long)out.
                                        super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                                        container + 8));
      cp = 0x72;
    }
  }
  else {
    if (((cp != 0x22) && (cp != 0x27)) && (cp != 0x5c)) {
LAB_0010a397:
      if (cp < 0x100) {
        aVar4 = write_codepoint<2ul,char,fmt::v10::appender>(out,'x',cp);
        return (appender)aVar4.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container
        ;
      }
      if (cp < 0x10000) {
        aVar4 = write_codepoint<4ul,char,fmt::v10::appender>(out,'u',cp);
        return (appender)aVar4.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container
        ;
      }
      if (cp < 0x110000) {
        aVar4 = write_codepoint<8ul,char,fmt::v10::appender>(out,'U',cp);
        return (appender)aVar4.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container
        ;
      }
      pbVar6 = (byte *)escape->begin;
      pbVar1 = (byte *)escape->end;
      if (-1 < (long)pbVar1 - (long)pbVar6) {
        for (; pbVar1 != pbVar6; pbVar6 = pbVar6 + 1) {
          out = write_codepoint<2ul,char,fmt::v10::appender>(out,'x',(uint)*pbVar6);
        }
        return (appender)
               out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container.container;
      }
      assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/evaikene[P]filefind/fmt/core.h"
                  ,0x178,"negative value");
    }
    lVar2 = *(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                            container + 0x10);
    uVar5 = lVar2 + 1;
    if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container +
                  0x18) < uVar5) {
      (*(code *)**(undefined8 **)
                  out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container)
                (out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container);
      lVar2 = *(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                              container + 0x10);
      uVar5 = lVar2 + 1;
    }
    *(ulong *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container +
              0x10) = uVar5;
    puVar3 = (undefined1 *)
             (lVar2 + *(long *)((long)out.
                                      super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                                      container + 8));
  }
  *puVar3 = 0x5c;
  lVar2 = *(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container
                   + 0x10);
  uVar5 = lVar2 + 1;
  if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container +
                0x18) < uVar5) {
    (*(code *)**(undefined8 **)
                out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container)
              (out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container);
    lVar2 = *(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                            container + 0x10);
    uVar5 = lVar2 + 1;
  }
  *(ulong *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container + 0x10)
       = uVar5;
  *(char *)(*(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                            container + 8) + lVar2) = (char)cp;
  return (appender)
         out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container.container;
}

Assistant:

auto write_escaped_cp(OutputIt out, const find_escape_result<Char>& escape)
    -> OutputIt {
  auto c = static_cast<Char>(escape.cp);
  switch (escape.cp) {
  case '\n':
    *out++ = static_cast<Char>('\\');
    c = static_cast<Char>('n');
    break;
  case '\r':
    *out++ = static_cast<Char>('\\');
    c = static_cast<Char>('r');
    break;
  case '\t':
    *out++ = static_cast<Char>('\\');
    c = static_cast<Char>('t');
    break;
  case '"':
    FMT_FALLTHROUGH;
  case '\'':
    FMT_FALLTHROUGH;
  case '\\':
    *out++ = static_cast<Char>('\\');
    break;
  default:
    if (escape.cp < 0x100) {
      return write_codepoint<2, Char>(out, 'x', escape.cp);
    }
    if (escape.cp < 0x10000) {
      return write_codepoint<4, Char>(out, 'u', escape.cp);
    }
    if (escape.cp < 0x110000) {
      return write_codepoint<8, Char>(out, 'U', escape.cp);
    }
    for (Char escape_char : basic_string_view<Char>(
             escape.begin, to_unsigned(escape.end - escape.begin))) {
      out = write_codepoint<2, Char>(out, 'x',
                                     static_cast<uint32_t>(escape_char) & 0xFF);
    }
    return out;
  }
  *out++ = c;
  return out;
}